

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O1

void __thiscall
bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
          (left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *this
          ,left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>
           *other)

{
  buf_type *pbVar1;
  size_type sVar2;
  uint uVar3;
  
  if (*(int *)&(this->super_type).
               super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
               field_0x8 < 0) {
    operator_delete((this->super_type).
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .buf_);
  }
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
       (buf_type *)0x0;
  *(undefined8 *)
   &(this->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x8 = 0;
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0;
  uVar3 = *(uint *)&(other->super_type).
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .field_0x8 & 0x7fffffff;
  if (((other->super_type).
       super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ -
      (other->super_type).
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_) +
      uVar3 < 0x21) {
    copy(this,(EVP_PKEY_CTX *)other,(EVP_PKEY_CTX *)(ulong)uVar3);
    if (*(int *)&(other->super_type).
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 field_0x8 < 0) {
      operator_delete((other->super_type).
                      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                      .buf_);
    }
    pbVar1 = (buf_type *)0x0;
    sVar2 = 0;
  }
  else {
    (this->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
         (other->super_type).
         super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_;
    uVar3 = *(uint *)&(other->super_type).
                      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                      .field_0x8 & 0x7fffffff;
    *(uint *)&(this->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x8 = uVar3;
    *(uint *)&(this->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x8 =
         *(uint *)&(other->super_type).
                   super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                   field_0x8 & 0x80000000 | uVar3;
    sVar2 = (other->super_type).
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
    (this->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ =
         (other->super_type).
         super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
    (this->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = sVar2;
    pbVar1 = &(other->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x14;
    sVar2 = 0x20;
  }
  (other->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ = pbVar1;
  *(size_type *)
   &(other->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x8 =
       sVar2;
  (other->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
  (other->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = sVar2;
  return;
}

Assistant:

void move(left_right_sequence& other) {
		this->clear(true);
		if (other.raw_size() <= base_type::inline_raw_cap) {
			copy(other);
			other.clear(true);
		}
		else {
			this->buf_   = other.buf_;
			this->cap_   = other.cap_;
			this->free_  = other.free_;
			this->left_  = other.left_;
			this->right_ = other.right_;
			other.buf_  = other.extra();
			other.cap_  = base_type::inline_raw_cap;
			other.free_ = 0;
			other.left_ = 0;
			other.right_= base_type::inline_raw_cap;
		}
	}